

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderArguments
          (ConversionStream *this,iterator *TypeToken,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *Globals,stringstream *ReturnHandlerSS,String *Prologue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StorageQualifier SVar2;
  InOutPatchType IVar3;
  bool bVar4;
  ShaderParameterInfo *pSVar5;
  HLSL2GLSLConverterImpl *pHVar6;
  pointer pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  __node_base_ptr p_Var14;
  size_t sVar15;
  ostream *poVar16;
  undefined8 *puVar17;
  long *plVar18;
  ConversionStream *pCVar19;
  _Hash_node_base *p_Var20;
  pointer pSVar21;
  ulong uVar22;
  undefined8 uVar23;
  ShaderParameterInfo **ppSVar24;
  pointer pSVar25;
  char *pcVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  _Hash_node_base *p_Var28;
  string msg;
  bool bConstFuncTakesInputPatch;
  String GLSLVariable;
  String VarName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> InputVarName;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  MemberStack;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack;
  unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  Attributes;
  iterator Token;
  stringstream PrologueSS;
  stringstream GlobalsSS;
  stringstream InterfaceVarsOutSS;
  stringstream InterfaceVarsInSS;
  undefined1 local_7e8 [47];
  bool local_7b9;
  undefined1 local_7b8 [24];
  pointer pcStack_7a0;
  String local_798;
  String local_778;
  pointer local_758;
  iterator iStack_750;
  __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
  *local_748;
  _Alloc_hider _Stack_740;
  undefined1 local_738 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  undefined1 local_718 [32];
  void *local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_6f0;
  int local_6d8;
  int local_6d4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d0;
  pointer local_6c0;
  pointer local_6b8;
  pointer local_6b0;
  _Hash_node_base *local_6a8;
  char *local_6a0;
  pointer local_698;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_690;
  iterator local_658;
  stringstream local_650 [16];
  long local_640 [14];
  ios_base aiStack_5d0 [264];
  key_type local_4c8;
  long local_4b8 [14];
  ios_base aiStack_448 [264];
  stringstream local_340 [128];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [128];
  ios_base aiStack_138 [264];
  
  local_658 = (iterator)TypeToken->_M_node;
  local_690._M_buckets = &local_690._M_single_bucket;
  local_690._M_bucket_count = 1;
  local_690._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_690._M_element_count = 0;
  local_690._M_rehash_policy._M_max_load_factor = 1.0;
  local_690._M_rehash_policy._M_next_resize = 0;
  local_690._M_single_bucket = (__node_base_ptr)0x0;
  local_6d0._M_allocated_capacity = (size_type)ReturnHandlerSS;
  ProcessShaderAttributes
            (this,&local_658,
             (unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_690);
  local_4c8.Str = "domain";
  local_4c8.Ownership_Hash = 0xcaaeccf1c670984;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_690._M_bucket_count;
  p_Var14 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_690,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xcaaeccf1c670984)) % auVar8,0),
                       &local_4c8,0xcaaeccf1c670984);
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var20 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var20 = p_Var14->_M_nxt;
  }
  if ((local_4c8.Str != (char *)0x0) && ((long)local_4c8.Ownership_Hash < 0)) {
    operator_delete__(local_4c8.Str);
  }
  if (p_Var20 != (_Hash_node_base *)0x0) {
    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var20 + 3);
    iVar13 = std::__cxx11::string::compare((char *)pbVar27);
    if (((iVar13 != 0) && (iVar13 = std::__cxx11::string::compare((char *)pbVar27), iVar13 != 0)) &&
       (iVar13 = std::__cxx11::string::compare((char *)pbVar27), iVar13 != 0)) {
      LogError<true,char[26],std::__cxx11::string,char[55]>
                (false,"ProcessHullShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xe1b,(char (*) [26])"Unexpected domain value \"",pbVar27,
                 (char (*) [55])"\". String constant \"tri\", \"quad\" or \"isoline\" expected");
    }
  }
  local_4c8.Str = "partitioning";
  local_4c8.Ownership_Hash = 0x2779e7fde7b9e178;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_690._M_bucket_count;
  p_Var14 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_690,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x2779e7fde7b9e178)) % auVar9,0),
                       &local_4c8,0x2779e7fde7b9e178);
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var20 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var20 = p_Var14->_M_nxt;
  }
  if ((local_4c8.Str != (char *)0x0) && ((long)local_4c8.Ownership_Hash < 0)) {
    operator_delete__(local_4c8.Str);
  }
  if (p_Var20 != (_Hash_node_base *)0x0) {
    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var20 + 3);
    iVar13 = std::__cxx11::string::compare((char *)pbVar27);
    if (((iVar13 != 0) && (iVar13 = std::__cxx11::string::compare((char *)pbVar27), iVar13 != 0)) &&
       ((iVar13 = std::__cxx11::string::compare((char *)pbVar27), iVar13 != 0 &&
        (iVar13 = std::__cxx11::string::compare((char *)pbVar27), iVar13 != 0)))) {
      LogError<true,char[26],std::__cxx11::string,char[86]>
                (false,"ProcessHullShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xe2a,(char (*) [26])"Unexpected partitioning \"",pbVar27,
                 (char (*) [86])
                 "\". String constant \"integer\", \"fractional_even\", \"fractional_odd\", or \"pow2\" expected"
                );
    }
  }
  local_4c8.Str = "outputtopology";
  local_4c8.Ownership_Hash = 0x507bd7cd66e764d0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_690._M_bucket_count;
  p_Var14 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_690,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x507bd7cd66e764d0)) % auVar10,0),
                       &local_4c8,0x507bd7cd66e764d0);
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var20 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var20 = p_Var14->_M_nxt;
  }
  if ((local_4c8.Str != (char *)0x0) && ((long)local_4c8.Ownership_Hash < 0)) {
    operator_delete__(local_4c8.Str);
  }
  if (p_Var20 != (_Hash_node_base *)0x0) {
    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var20 + 3);
    iVar13 = std::__cxx11::string::compare((char *)pbVar27);
    if ((((iVar13 != 0) && (iVar13 = std::__cxx11::string::compare((char *)pbVar27), iVar13 != 0))
        && (iVar13 = std::__cxx11::string::compare((char *)pbVar27), iVar13 != 0)) &&
       (iVar13 = std::__cxx11::string::compare((char *)pbVar27), iVar13 != 0)) {
      LogError<true,char[22],std::__cxx11::string,char[78]>
                (false,"ProcessHullShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xe39,(char (*) [22])"Unexpected topology \"",pbVar27,
                 (char (*) [78])
                 "\". String constant \"point\", \"line\", \"triangle_cw\", or \"triangle_ccw\" expected"
                );
    }
  }
  local_4c8.Str = "patchconstantfunc";
  local_4c8.Ownership_Hash = 0x11f5e5b0fee478d0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_690._M_bucket_count;
  p_Var14 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_690,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x11f5e5b0fee478d0)) % auVar11,0),
                       &local_4c8,0x11f5e5b0fee478d0);
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var20 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var20 = p_Var14->_M_nxt;
  }
  local_6b0 = (pointer)Prologue;
  if ((local_4c8.Str != (char *)0x0) && ((long)local_4c8.Ownership_Hash < 0)) {
    operator_delete__(local_4c8.Str);
  }
  if (p_Var20 == (_Hash_node_base *)0x0) {
    LogError<true,char[88]>
              (false,"ProcessHullShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xe3e,(char (*) [88])
                      "Hull shader patch constant function is not specified. Use \"patchconstantfunc\" attribute"
              );
  }
  local_4c8.Str = "outputcontrolpoints";
  local_4c8.Ownership_Hash = 0x653d806a61a429df;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_690._M_bucket_count;
  p_Var14 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_find_before_node
                      (&local_690,
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x653d806a61a429df)) % auVar12,0),
                       &local_4c8,0x653d806a61a429df);
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var28 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var28 = p_Var14->_M_nxt;
  }
  if ((local_4c8.Str != (char *)0x0) && ((long)local_4c8.Ownership_Hash < 0)) {
    operator_delete__(local_4c8.Str);
  }
  local_6b8 = (pointer)Globals;
  if (p_Var28 == (_Hash_node_base *)0x0) {
    LogError<true,char[86]>
              (false,"ProcessHullShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xe43,(char (*) [86])
                      "Number of output control points is not specified. Use \"outputcontrolpoints\" attribute"
              );
  }
  p_Var28 = p_Var28[3]._M_nxt;
  local_7b9 = false;
  local_6a8 = p_Var20[3]._M_nxt;
  ProcessHullShaderConstantFunction(this,(Char *)local_6a8,&local_7b9);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_4c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"layout(vertices = ",0x12)
  ;
  if (p_Var28 == (_Hash_node_base *)0x0) {
    std::ios::clear((int)(ostream *)local_4b8 + (int)*(undefined8 *)(local_4b8[0] + -0x18));
  }
  else {
    sVar15 = strlen((char *)p_Var28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,(char *)p_Var28,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,") out;\n",7);
  std::__cxx11::stringstream::stringstream(local_650);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  pSVar21 = (Params->
            super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_698 = (Params->
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar21 != local_698) {
    local_6d0._M_allocated_capacity = local_6d0._M_allocated_capacity + 0x10;
    local_6d8 = 0;
    local_6d4 = 0;
    local_6d0._8_8_ = this;
    do {
      SVar2 = pSVar21->storageQualifier;
      if ((SVar2 == Ret) || (SVar2 == Out)) {
        local_7b8._0_8_ = (pointer)0x0;
        local_7b8._8_8_ = (pointer)0x0;
        local_7b8._16_8_ = (ShaderParameterInfo **)0x0;
        local_748 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                     *)0x0;
        local_758 = (pointer)0x0;
        iStack_750._M_current =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_7e8._0_8_ = pSVar21;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)local_7b8,(iterator)0x0,(ShaderParameterInfo **)local_7e8);
        local_7e8._0_8_ =
             (pSVar21->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (iStack_750._M_current == local_748) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_758,iStack_750,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_7e8);
        }
        else {
          (iStack_750._M_current)->_M_current = (ShaderParameterInfo *)local_7e8._0_8_;
          iStack_750._M_current = iStack_750._M_current + 1;
        }
        if (((pSVar21->storageQualifier != Ret) && ((pSVar21->GSAttribs).PrimType == Undefined)) &&
           ((pSVar21->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
          pcVar26 = (pSVar21->Type)._M_dataplus._M_p;
          if (pcVar26 == (char *)0x0) {
            std::ios::clear((int)local_640 + (int)*(undefined8 *)(local_640[0] + -0x18));
          }
          else {
            sVar15 = strlen(pcVar26);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,pcVar26,sVar15);
          }
          local_7e8[0] = (string)0x20;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_640,local_7e8,1);
          pcVar26 = (pSVar21->Name)._M_dataplus._M_p;
          if (pcVar26 == (char *)0x0) {
            std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
          }
          else {
            sVar15 = strlen(pcVar26);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar26,sVar15);
          }
          if ((pSVar21->ArraySize)._M_string_length != 0) {
            local_7e8[0] = (string)0x5b;
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_640,local_7e8,1);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,(pSVar21->ArraySize)._M_dataplus._M_p,
                                 (pSVar21->ArraySize)._M_string_length);
            local_7e8[0] = (string)0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_7e8,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,";\n",2);
        }
        while (local_7b8._0_8_ != local_7b8._8_8_) {
          pSVar5 = (((pointer)(local_7b8._8_8_ + -0xa0))->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pSVar25 = (pSVar5->members).
                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((pSVar5->members).
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              ._M_impl.super__Vector_impl_data._M_start == pSVar25) {
            if (iStack_750._M_current[-1]._M_current != pSVar25) {
              FormatString<char[26],char[49]>
                        ((string *)local_7e8,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                         (char (*) [49])iStack_750._M_current);
              DebugAssertionFailed
                        ((Char *)local_7e8._0_8_,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb19);
              if ((pointer)local_7e8._0_8_ != (pointer)(local_7e8 + 0x10)) {
                operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
              }
            }
            if ((pSVar5->Semantic)._M_string_length == 0) {
              LogError<true,char[36],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar5->Name,
                         (char (*) [2])0x70aecf);
            }
            local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
            local_778._M_string_length = 0;
            local_778.field_2._M_local_buf[0] = '\0';
            pHVar6 = this->m_Converter;
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)local_7e8,(pSVar5->Semantic)._M_dataplus._M_p,false);
            pCVar19 = (ConversionStream *)
                      ((local_7e8._8_8_ & 0x7fffffffffffffff) %
                      (pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[1]._M_h._M_bucket_count
                      );
            p_Var14 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_before_node
                                (&(pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[1]._M_h,
                                 (size_type)pCVar19,(HashMapStringKey *)local_7e8,
                                 local_7e8._8_8_ & 0x7fffffffffffffff);
            if (p_Var14 == (__node_base_ptr)0x0) {
              p_Var20 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var20 = p_Var14->_M_nxt;
            }
            if (((pointer)local_7e8._0_8_ != (pointer)0x0) && ((long)local_7e8._8_8_ < 0)) {
              operator_delete__((void *)local_7e8._0_8_);
            }
            if (p_Var20 != (_Hash_node_base *)0x0) {
              pCVar19 = (ConversionStream *)(p_Var20 + 3);
              std::__cxx11::string::_M_assign((string *)&local_778);
            }
            pcVar26 = "";
            if (pSVar5->storageQualifier == Ret) {
              pcVar26 = "_RET_VAL_";
            }
            BuildParameterName_abi_cxx11_
                      ((String *)local_7e8,pCVar19,
                       (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                        *)local_7b8,'.',"",pcVar26,"");
            if (local_778._M_string_length == 0) {
              pcVar26 = "_";
              if (this->m_bUseInOutLocationQualifiers != false) {
                pcVar26 = "_hsout_";
              }
              BuildParameterName_abi_cxx11_
                        (&local_798,pCVar19,
                         (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                          *)local_7b8,'_',pcVar26,"","");
              bVar4 = this->m_bUseInOutLocationQualifiers;
              iVar13 = -1;
              if (bVar4 != false) {
                iVar13 = local_6d4;
              }
              pcVar26 = GetInterpolationQualifier(this,pSVar5);
              local_738._0_8_ = local_738 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_738,local_798._M_dataplus._M_p,
                         local_798._M_dataplus._M_p + local_798._M_string_length);
              std::__cxx11::string::append((char *)local_738);
              DefineInterfaceVar(iVar13,pcVar26,"out",&pSVar5->Type,(String *)local_738,
                                 (stringstream *)local_340);
              if ((undefined1 *)local_738._0_8_ != local_738 + 0x10) {
                operator_delete((void *)local_738._0_8_,local_728._0_8_ + 1);
              }
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_6d0._M_allocated_capacity,
                                   local_798._M_dataplus._M_p,local_798._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,"[gl_InvocationID] = ",0x14);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,(char *)local_7e8._0_8_,local_7e8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\\\n",3);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_798._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&local_798 + 0x10U)) {
                operator_delete(local_798._M_dataplus._M_p,local_798.field_2._0_8_ + 1);
              }
              local_6d4 = local_6d4 + (uint)bVar4;
              this = (ConversionStream *)local_6d0._8_8_;
            }
            else {
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_6d0._M_allocated_capacity,
                                   local_778._M_dataplus._M_p,local_778._M_string_length);
              local_798._M_dataplus._M_p._0_1_ = 0x28;
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,(char *)&local_798,1);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,(char *)local_7e8._0_8_,local_7e8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,");\\\n",4);
            }
            if ((pointer)local_7e8._0_8_ != (pointer)(local_7e8 + 0x10)) {
              operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
            }
            local_7b8._8_8_ =
                 &(((pointer)(local_7b8._8_8_ + -0xa0))->members).
                  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
            iStack_750._M_current = iStack_750._M_current + -1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_778._M_dataplus._M_p != &local_778.field_2) {
              operator_delete(local_778._M_dataplus._M_p,
                              CONCAT71(local_778.field_2._1_7_,local_778.field_2._M_local_buf[0]) +
                              1);
            }
          }
          else {
            if ((pSVar5->Semantic)._M_string_length != 0) {
              LogError<true,char[35],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar5->Name,
                         (char (*) [2])0x70aecf);
            }
            pSVar25 = iStack_750._M_current[-1]._M_current;
            if (pSVar25 ==
                (pSVar5->members).
                super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_7b8._8_8_ = local_7b8._8_8_ + -8;
              iStack_750._M_current = iStack_750._M_current + -1;
            }
            else {
              iStack_750._M_current[-1]._M_current = pSVar25 + 1;
              if (local_7b8._8_8_ == local_7b8._16_8_) {
                local_7e8._0_8_ = pSVar25;
                std::
                vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                ::
                _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                          ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                            *)local_7b8,(iterator)local_7b8._8_8_,(ShaderParameterInfo **)local_7e8)
                ;
              }
              else {
                *(pointer *)local_7b8._8_8_ = pSVar25;
                local_7b8._8_8_ = local_7b8._8_8_ + 8;
              }
              local_7e8._0_8_ =
                   (pSVar25->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (iStack_750._M_current == local_748) {
                std::
                vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                ::
                _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                          ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                            *)&local_758,iStack_750,
                           (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                            *)local_7e8);
              }
              else {
                (iStack_750._M_current)->_M_current = (ShaderParameterInfo *)local_7e8._0_8_;
                iStack_750._M_current = iStack_750._M_current + 1;
              }
            }
          }
        }
        if (local_758 != (pointer)0x0) {
          operator_delete(local_758,(long)local_748 - (long)local_758);
        }
        if ((pointer)local_7b8._0_8_ != (pointer)0x0) {
          uVar22 = local_7b8._16_8_ - local_7b8._0_8_;
          pSVar25 = (pointer)local_7b8._0_8_;
LAB_002dc9d7:
          operator_delete(pSVar25,uVar22);
        }
      }
      else if (SVar2 == In) {
        IVar3 = (pSVar21->HSAttribs).PatchType;
        if (IVar3 == InputPatch) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_640,"    const int _NumInputPoints = ",0x20);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_640,(pSVar21->ArraySize)._M_dataplus._M_p,
                               (pSVar21->ArraySize)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_640,(pSVar21->Type)._M_dataplus._M_p,
                               (pSVar21->Type)._M_string_length);
          local_7e8[0] = (string)0x20;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_7e8,1);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,(pSVar21->Name)._M_dataplus._M_p,
                               (pSVar21->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"[_NumInputPoints];\n",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_640,"    for(int i=0; i < gl_PatchVerticesIn; ++i)\n    {\n",
                     0x34);
        }
        local_718._16_8_ = (ShaderParameterInfo **)0x0;
        local_718._0_8_ = (ShaderParameterInfo **)0x0;
        local_718._8_8_ = (ShaderParameterInfo **)0x0;
        aStack_6f0._8_8_ =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_6f8 = (void *)0x0;
        aStack_6f0._M_allocated_capacity = 0;
        local_7e8._0_8_ = pSVar21;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)local_718,(iterator)0x0,(ShaderParameterInfo **)local_7e8);
        local_7e8._0_8_ =
             (pSVar21->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (aStack_6f0._M_allocated_capacity == aStack_6f0._8_8_) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_6f8,(iterator)aStack_6f0._M_allocated_capacity,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_7e8);
        }
        else {
          *(undefined8 *)aStack_6f0._M_allocated_capacity = local_7e8._0_8_;
          aStack_6f0._M_allocated_capacity = aStack_6f0._M_allocated_capacity + 8;
        }
        if (((pSVar21->storageQualifier != Ret) && ((pSVar21->GSAttribs).PrimType == Undefined)) &&
           ((pSVar21->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
          pcVar26 = (pSVar21->Type)._M_dataplus._M_p;
          if (pcVar26 == (char *)0x0) {
            std::ios::clear((int)local_640 + (int)*(undefined8 *)(local_640[0] + -0x18));
          }
          else {
            sVar15 = strlen(pcVar26);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,pcVar26,sVar15);
          }
          local_7e8[0] = (string)0x20;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_640,local_7e8,1);
          pcVar26 = (pSVar21->Name)._M_dataplus._M_p;
          if (pcVar26 == (char *)0x0) {
            std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
          }
          else {
            sVar15 = strlen(pcVar26);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar26,sVar15);
          }
          if ((pSVar21->ArraySize)._M_string_length != 0) {
            local_7e8[0] = (string)0x5b;
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_640,local_7e8,1);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,(pSVar21->ArraySize)._M_dataplus._M_p,
                                 (pSVar21->ArraySize)._M_string_length);
            local_7e8[0] = (string)0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_7e8,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,";\n",2);
        }
        if (local_718._0_8_ != local_718._8_8_) {
          local_6c0 = (pointer)0x6e6688;
          if (IVar3 == InputPatch) {
            local_6c0 = (pointer)0x6fa8c0;
          }
          local_6a0 = "";
          if (IVar3 == InputPatch) {
            local_6a0 = "[]";
          }
          do {
            pSVar5 = *(ShaderParameterInfo **)(local_718._8_8_ - 8);
            pSVar25 = (pSVar5->members).
                      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if ((pSVar5->members).
                super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                ._M_impl.super__Vector_impl_data._M_start == pSVar25) {
              if (((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                    *)(aStack_6f0._M_allocated_capacity - 8))->_M_current != pSVar25) {
                FormatString<char[26],char[49]>
                          ((string *)local_7e8,(Diligent *)"Debug expression failed:\n",
                           (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                           (char (*) [49])aStack_6f0._M_allocated_capacity);
                DebugAssertionFailed
                          ((Char *)local_7e8._0_8_,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb19);
                if ((pointer)local_7e8._0_8_ != (pointer)(local_7e8 + 0x10)) {
                  operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
                }
              }
              if ((pSVar5->Semantic)._M_string_length == 0) {
                LogError<true,char[36],std::__cxx11::string,char[2]>
                          (false,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",
                           &pSVar5->Name,(char (*) [2])0x70aecf);
              }
              local_7b8._0_8_ = local_7b8 + 0x10;
              local_7b8._8_8_ =
                   (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                    *)0x0;
              local_7b8._16_8_ = local_7b8._16_8_ & 0xffffffffffffff00;
              pHVar6 = this->m_Converter;
              HashMapStringKey::HashMapStringKey
                        ((HashMapStringKey *)local_7e8,(pSVar5->Semantic)._M_dataplus._M_p,false);
              pCVar19 = (ConversionStream *)
                        ((local_7e8._8_8_ & 0x7fffffffffffffff) %
                        (pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[0]._M_h.
                        _M_bucket_count);
              p_Var14 = std::
                        _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::_M_find_before_node
                                  ((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                    *)((pHVar6->m_HLSLSemanticToGLSLVar)._M_elems + 3),
                                   (size_type)pCVar19,(HashMapStringKey *)local_7e8,
                                   local_7e8._8_8_ & 0x7fffffffffffffff);
              if (p_Var14 == (__node_base_ptr)0x0) {
                p_Var20 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var20 = p_Var14->_M_nxt;
              }
              if (((pointer)local_7e8._0_8_ != (pointer)0x0) && ((long)local_7e8._8_8_ < 0)) {
                operator_delete__((void *)local_7e8._0_8_);
              }
              if (p_Var20 != (_Hash_node_base *)0x0) {
                pCVar19 = (ConversionStream *)(p_Var20 + 3);
                std::__cxx11::string::_M_assign((string *)local_7b8);
              }
              local_758 = (pointer)&local_748;
              if ((pointer)local_7b8._0_8_ == (pointer)(local_7b8 + 0x10)) {
                _Stack_740._M_p = pcStack_7a0;
              }
              else {
                local_758 = (pointer)local_7b8._0_8_;
              }
              local_748 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                           *)local_7b8._16_8_;
              iStack_750._M_current =
                   (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                    *)local_7b8._8_8_;
              local_7b8._8_8_ = (pointer)0x0;
              local_7b8._16_8_ = local_7b8._16_8_ & 0xffffffffffffff00;
              local_7b8._0_8_ = (pointer)(local_7b8 + 0x10);
              BuildParameterName_abi_cxx11_
                        ((String *)local_7e8,pCVar19,
                         (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                          *)local_718,'.',"","",(Char *)local_6c0);
              if (IVar3 == InputPatch) {
                pCVar19 = (ConversionStream *)0x6dfdbe;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
              }
              if (iStack_750._M_current ==
                  (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                   *)0x0) {
                pcVar26 = "_";
                if (this->m_bUseInOutLocationQualifiers != false) {
                  pcVar26 = "_hsin_";
                }
                BuildParameterName_abi_cxx11_
                          (&local_798,pCVar19,
                           (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                            *)local_718,'_',pcVar26,"","");
                local_738._0_8_ = local_738 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_738,local_798._M_dataplus._M_p,
                           local_798._M_dataplus._M_p + local_798._M_string_length);
                std::__cxx11::string::append((char *)local_738);
                bVar4 = this->m_bUseInOutLocationQualifiers;
                iVar13 = -1;
                if (bVar4 != false) {
                  iVar13 = local_6d8;
                }
                pcVar26 = GetInterpolationQualifier(this,pSVar5);
                local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_778,local_798._M_dataplus._M_p,
                           local_798._M_dataplus._M_p + local_798._M_string_length);
                std::__cxx11::string::append((char *)&local_778);
                DefineInterfaceVar(iVar13,pcVar26,"in",&pSVar5->Type,&local_778,
                                   (stringstream *)local_1b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_778._M_dataplus._M_p != &local_778.field_2) {
                  operator_delete(local_778._M_dataplus._M_p,
                                  CONCAT71(local_778.field_2._1_7_,local_778.field_2._M_local_buf[0]
                                          ) + 1);
                }
                InitVariable((String *)local_7e8,(String *)local_738,(stringstream *)local_650);
                if ((undefined1 *)local_738._0_8_ != local_738 + 0x10) {
                  operator_delete((void *)local_738._0_8_,local_728._0_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_798._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&local_798 + 0x10U)) {
                  operator_delete(local_798._M_dataplus._M_p,local_798.field_2._0_8_ + 1);
                }
                local_6d8 = local_6d8 + (uint)bVar4;
                this = (ConversionStream *)local_6d0._8_8_;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_640,(char *)local_758,
                                     (long)iStack_750._M_current);
                local_798._M_dataplus._M_p._0_1_ = 0x28;
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(char *)&local_798,1);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(char *)local_7e8._0_8_,local_7e8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,");\n",3);
              }
              if ((pointer)local_7e8._0_8_ != (pointer)(local_7e8 + 0x10)) {
                operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
              }
              if (local_758 != (pointer)&local_748) {
                operator_delete(local_758,(ulong)((long)&local_748->_M_current + 1));
              }
              local_718._8_8_ = local_718._8_8_ - 8;
              aStack_6f0._M_allocated_capacity = aStack_6f0._M_allocated_capacity - 8;
              if ((pointer)local_7b8._0_8_ != (pointer)(local_7b8 + 0x10)) {
                operator_delete((void *)local_7b8._0_8_,(ulong)(local_7b8._16_8_ + 1));
              }
            }
            else {
              if ((pSVar5->Semantic)._M_string_length != 0) {
                LogError<true,char[35],std::__cxx11::string,char[2]>
                          (false,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar5->Name
                           ,(char (*) [2])0x70aecf);
              }
              pSVar25 = ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                          *)(aStack_6f0._M_allocated_capacity - 8))->_M_current;
              if (pSVar25 ==
                  (pSVar5->members).
                  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                local_718._8_8_ = local_718._8_8_ - 8;
                aStack_6f0._M_allocated_capacity =
                     (size_type)
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)(aStack_6f0._M_allocated_capacity - 8);
              }
              else {
                ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                  *)(aStack_6f0._M_allocated_capacity - 8))->_M_current = pSVar25 + 1;
                if (local_718._8_8_ == local_718._16_8_) {
                  local_7e8._0_8_ = pSVar25;
                  std::
                  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                  ::
                  _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                            ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                              *)local_718,(iterator)local_718._8_8_,
                             (ShaderParameterInfo **)local_7e8);
                }
                else {
                  *(pointer *)local_718._8_8_ = pSVar25;
                  local_718._8_8_ = local_718._8_8_ + 8;
                }
                local_7e8._0_8_ =
                     (pSVar25->members).
                     super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                if (aStack_6f0._M_allocated_capacity == aStack_6f0._8_8_) {
                  std::
                  vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                  ::
                  _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                            ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                              *)&local_6f8,(iterator)aStack_6f0._M_allocated_capacity,
                             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                              *)local_7e8);
                }
                else {
                  *(undefined8 *)aStack_6f0._M_allocated_capacity = local_7e8._0_8_;
                  aStack_6f0._M_allocated_capacity =
                       (size_type)
                       (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                        *)(aStack_6f0._M_allocated_capacity + 8);
                }
              }
            }
          } while (local_718._0_8_ != local_718._8_8_);
        }
        pSVar25 = (pointer)(local_7e8 + 0x10);
        if (local_6f8 != (void *)0x0) {
          operator_delete(local_6f8,aStack_6f0._8_8_ - (long)local_6f8);
        }
        if ((ShaderParameterInfo **)local_718._0_8_ != (ShaderParameterInfo **)0x0) {
          operator_delete((void *)local_718._0_8_,local_718._16_8_ - local_718._0_8_);
        }
        if (IVar3 == InputPatch) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    }\n",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_640,"    ",4);
          p_Var20 = local_6a8;
          if (local_6a8 == (_Hash_node_base *)0x0) {
            std::ios::clear((int)local_640 + (int)*(undefined8 *)(local_640[0] + -0x18));
          }
          else {
            sVar15 = strlen((char *)local_6a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_640,(char *)p_Var20,sVar15);
          }
          local_7e8[0] = (string)0x28;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_640,local_7e8,1);
          local_7e8._0_8_ = pSVar25;
          if (local_7b9 == true) {
            pcVar7 = (pSVar21->Name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_7e8,pcVar7,pcVar7 + (pSVar21->Name)._M_string_length);
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"");
          }
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,(char *)local_7e8._0_8_,local_7e8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,");\n",3);
          if ((pointer)local_7e8._0_8_ != pSVar25) {
            uVar22 = local_7e8._16_8_ + 1;
            pSVar25 = (pointer)local_7e8._0_8_;
            goto LAB_002dc9d7;
          }
        }
      }
      pSVar21 = pSVar21 + 1;
    } while (pSVar21 != local_698);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_6b0,(string *)local_7e8);
  pSVar21 = (pointer)(local_7e8 + 0x10);
  if ((pointer)local_7e8._0_8_ != pSVar21) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  uVar23 = 0xf;
  if ((undefined1 *)local_738._0_8_ != local_738 + 0x10) {
    uVar23 = local_728._0_8_;
  }
  if ((ulong)uVar23 < local_778._M_string_length + local_738._8_8_) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._M_dataplus._M_p != &local_778.field_2) {
      uVar22 = CONCAT71(local_778.field_2._1_7_,local_778.field_2._M_local_buf[0]);
    }
    if (uVar22 < local_778._M_string_length + local_738._8_8_) goto LAB_002dd385;
    puVar17 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_778,0,(char *)0x0,local_738._0_8_);
  }
  else {
LAB_002dd385:
    puVar17 = (undefined8 *)
              std::__cxx11::string::_M_append(local_738,(ulong)local_778._M_dataplus._M_p);
  }
  local_798._M_dataplus._M_p = (pointer)((long)&local_798 + 0x10);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar17 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar17 == paVar1) {
    local_798.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_798.field_2._8_8_ = puVar17[3];
  }
  else {
    local_798.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_798._M_dataplus._M_p = (pointer)*puVar17;
  }
  local_798._M_string_length = puVar17[1];
  *puVar17 = paVar1;
  puVar17[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  uVar23 = (undefined1 *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_798 + 0x10U)) {
    uVar23 = local_798.field_2._0_8_;
  }
  if ((ulong)uVar23 < (StorageQualifier *)local_7b8._8_8_ + local_798._M_string_length) {
    ppSVar24 = (ShaderParameterInfo **)0xf;
    if ((pointer)local_7b8._0_8_ != (pointer)(local_7b8 + 0x10)) {
      ppSVar24 = (ShaderParameterInfo **)local_7b8._16_8_;
    }
    if ((StorageQualifier *)local_7b8._8_8_ + local_798._M_string_length <= ppSVar24) {
      plVar18 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_7b8,0,(char *)0x0,(ulong)local_798._M_dataplus._M_p)
      ;
      goto LAB_002dd46b;
    }
  }
  plVar18 = (long *)std::__cxx11::string::_M_append((char *)&local_798,local_7b8._0_8_);
LAB_002dd46b:
  pSVar25 = (pointer)(plVar18 + 2);
  if ((pointer)*plVar18 == pSVar25) {
    local_7e8[0x10] = pSVar25->storageQualifier;
    local_7e8[0x11] = pSVar25->interpolationQualifier;
    local_7e8[0x12] = (pSVar25->GSAttribs).PrimType;
    local_7e8[0x13] = (pSVar25->GSAttribs).Stream;
    local_7e8[0x14] = pSVar25->HSAttribs;
    local_7e8._21_3_ = *(undefined3 *)&pSVar25->field_0x5;
    local_7e8._24_8_ = plVar18[3];
    local_7e8._0_8_ = pSVar21;
  }
  else {
    local_7e8[0x10] = pSVar25->storageQualifier;
    local_7e8[0x11] = pSVar25->interpolationQualifier;
    local_7e8[0x12] = (pSVar25->GSAttribs).PrimType;
    local_7e8[0x13] = (pSVar25->GSAttribs).Stream;
    local_7e8[0x14] = pSVar25->HSAttribs;
    local_7e8._21_3_ = *(undefined3 *)&pSVar25->field_0x5;
    local_7e8._0_8_ = (pointer)*plVar18;
  }
  local_7e8._8_8_ = plVar18[1];
  *plVar18 = (long)pSVar25;
  plVar18[1] = 0;
  pSVar25->storageQualifier = Unknown;
  std::__cxx11::string::operator=((string *)local_6b8,(string *)local_7e8);
  if ((pointer)local_7e8._0_8_ != pSVar21) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  if ((pointer)local_7b8._0_8_ != (pointer)(local_7b8 + 0x10)) {
    operator_delete((void *)local_7b8._0_8_,(ulong)(local_7b8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_798 + 0x10U)) {
    operator_delete(local_798._M_dataplus._M_p,(ulong)(local_798.field_2._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,
                    CONCAT71(local_778.field_2._1_7_,local_778.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_738._0_8_ != local_738 + 0x10) {
    operator_delete((void *)local_738._0_8_,local_728._0_8_ + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::__cxx11::stringstream::~stringstream(local_650);
  std::ios_base::~ios_base(aiStack_5d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_4c8);
  std::ios_base::~ios_base(aiStack_448);
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_690);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderArguments(TokenListType::iterator&          TypeToken,
                                                                          std::vector<ShaderParameterInfo>& Params,
                                                                          String&                           Globals,
                                                                          std::stringstream&                ReturnHandlerSS,
                                                                          String&                           Prologue)
{
    auto Token = TypeToken;
    // [...]
    // HSOutput main(InputPatch<VSOutput, 1> inputPatch, uint uCPID : SV_OutputControlPointID)
    // ^
    enum class Domain
    {
        undefined,
        tri,
        quad,
        isoline
    } domain = Domain::undefined;
    enum class Partitioning
    {
        undefined,
        integer,
        fractional_even,
        fractional_odd,
        pow2
    } partitioning = Partitioning::undefined;
    enum class OutputTopology
    {
        undefined,
        point,
        line,
        triangle_cw,
        triangle_ccw
    } topology = OutputTopology::undefined;

    std::unordered_map<HashMapStringKey, String> Attributes;
    ProcessShaderAttributes(Token, Attributes);

    auto DomainIt = Attributes.find("domain");
    if (DomainIt != Attributes.end())
    {
        if (DomainIt->second == "tri")
            domain = Domain::tri;
        else if (DomainIt->second == "quad")
            domain = Domain::quad;
        else if (DomainIt->second == "isoline")
            domain = Domain::isoline;
        else
            LOG_ERROR_AND_THROW("Unexpected domain value \"", DomainIt->second, "\". String constant \"tri\", \"quad\" or \"isoline\" expected");
    }

    auto PartitioningIt = Attributes.find("partitioning");
    if (PartitioningIt != Attributes.end())
    {
        if (PartitioningIt->second == "integer")
            partitioning = Partitioning::integer;
        else if (PartitioningIt->second == "fractional_even")
            partitioning = Partitioning::fractional_even;
        else if (PartitioningIt->second == "fractional_odd")
            partitioning = Partitioning::fractional_odd;
        else if (PartitioningIt->second == "pow2")
            partitioning = Partitioning::pow2;
        else
            LOG_ERROR_AND_THROW("Unexpected partitioning \"", PartitioningIt->second, "\". String constant \"integer\", \"fractional_even\", \"fractional_odd\", or \"pow2\" expected");
    }

    auto TopologyIt = Attributes.find("outputtopology");
    if (TopologyIt != Attributes.end())
    {
        if (TopologyIt->second == "point")
            topology = OutputTopology::point;
        else if (TopologyIt->second == "line")
            topology = OutputTopology::line;
        else if (TopologyIt->second == "triangle_cw")
            topology = OutputTopology::triangle_cw;
        else if (TopologyIt->second == "triangle_ccw")
            topology = OutputTopology::triangle_ccw;
        else
            LOG_ERROR_AND_THROW("Unexpected topology \"", TopologyIt->second, "\". String constant \"point\", \"line\", \"triangle_cw\", or \"triangle_ccw\" expected");
    }

    auto ConstFuncIt = Attributes.find("patchconstantfunc");
    if (ConstFuncIt == Attributes.end())
        LOG_ERROR_AND_THROW("Hull shader patch constant function is not specified. Use \"patchconstantfunc\" attribute");

    //auto MaxTessFactorIt = Attributes.find("maxtessfactor");
    auto NumControlPointsIt = Attributes.find("outputcontrolpoints");
    if (NumControlPointsIt == Attributes.end())
        LOG_ERROR_AND_THROW("Number of output control points is not specified. Use \"outputcontrolpoints\" attribute");
    const Char* NumControlPoints = NumControlPointsIt->second.c_str();

    bool        bConstFuncTakesInputPatch = false;
    const Char* ConstantFunc              = ConstFuncIt->second.c_str();
    ProcessHullShaderConstantFunction(ConstantFunc, bConstFuncTakesInputPatch);

    stringstream GlobalsSS;
    (void)domain;
    (void)partitioning;
    (void)topology;
    // In glsl, domain, partitioning, and topology are properties of tessellation evaluation
    // shader rather than tessellation control shader

    /*GlobalsSS << "layout(";
    switch (domain)
    {
        case Domain::tri:     GlobalsSS << "triangles"; break;
        case Domain::isoline: GlobalsSS << "isolines";  break;
        case Domain::quad:    GlobalsSS << "quads";     break;
        default: LOG_ERROR_AND_THROW( "Hull shader must specify domain" );
    }
    switch (partitioning)
    {
        case Partitioning::integer:         GlobalsSS << ", equal_spacing";           break;
        case Partitioning::fractional_even: GlobalsSS << ", fractional_even_spacing"; break;
        case Partitioning::fractional_odd:  GlobalsSS << ", fractional_odd_spacing";  break;
        case Partitioning::pow2:
            LOG_WARNING_MESSAGE( "OpenGL does not support pow2 partitioning. Using integer instead" );
            GlobalsSS << ", equal_spacing";
        break;
    }
    switch (topology)
    {
        case OutputTopology::line:  break;
        case OutputTopology::point: break;
        case OutputTopology::triangle_ccw: GlobalsSS << ", ccw"; break;
        case OutputTopology::triangle_cw:  GlobalsSS << ", cw";  break;
    }
    GlobalsSS << ") in;\n";*/
    GlobalsSS << "layout(vertices = " << NumControlPoints << ") out;\n";

    std::stringstream PrologueSS, InterfaceVarsInSS, InterfaceVarsOutSS;
    int               inLocation = 0, outLocation = 0;
    for (const auto& TopLevelParam : Params)
    {
        if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            bool IsPatch = TopLevelParam.HSAttribs.PatchType == ShaderParameterInfo::HSAttributes::InOutPatchType::InputPatch;
            if (IsPatch)
            {
                PrologueSS << "    const int _NumInputPoints = " << TopLevelParam.ArraySize << ";\n"; // gl_MaxPatchVertices
                PrologueSS << "    " << TopLevelParam.Type << ' ' << TopLevelParam.Name << "[_NumInputPoints];\n";
                // Iterate of the actual number of vertices in the input patch
                PrologueSS << "    for(int i=0; i < gl_PatchVerticesIn; ++i)\n    {\n";
            }

            ProcessShaderArgument(
                TopLevelParam, HSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, String Getter) //
                {
                    // All inputs from vertex shaders to the TCS are aggregated into arrays, based on the size of the input patch.
                    // The size of these arrays is the number of input patches provided by the patch primitive.
                    // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Inputs
                    String FullIndexedParamName = BuildParameterName(MemberStack, '.', "", "", IsPatch ? "[i]" : "");
                    if (IsPatch)
                        PrologueSS << "    ";
                    if (!Getter.empty())
                        PrologueSS << "    " << Getter << '(' << FullIndexedParamName << ");\n";
                    else
                    {
                        auto VarName      = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_hsin_" : "_");
                        auto InputVarName = VarName + (IsPatch ? "[i]" : "");
                        // User-defined inputs can be declared as unbounded arrays
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? inLocation++ : -1,
                                           GetInterpolationQualifier(Param), "in",
                                           Param.Type, VarName + (IsPatch ? "[]" : ""), InterfaceVarsInSS);
                        InitVariable(FullIndexedParamName, InputVarName, PrologueSS);
                    }
                } //
            );

            if (IsPatch)
            {
                PrologueSS << "    }\n";
                // Add call to the constant function
                // Multiple TCS invocations for the same patch can write to the same tessellation level variable,
                // so long as they are all computing and writing the exact same value.
                // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Outputs
                PrologueSS << "    " << ConstantFunc << '(' << (bConstFuncTakesInputPatch ? TopLevelParam.Name : "") << ");\n";
            }
        }
        else if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                TopLevelParam, HSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String SrcParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (!Setter.empty())
                        ReturnHandlerSS << Setter << '(' << SrcParamName << ");\\\n";
                    else
                    {
                        auto OutputVarName = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_hsout_" : "_");
                        // Per-vertex outputs are aggregated into arrays.
                        // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Outputs
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? outLocation++ : -1,
                                           GetInterpolationQualifier(Param), "out",
                                           Param.Type, OutputVarName + "[]", InterfaceVarsOutSS);
                        // A TCS can only ever write to the per-vertex output variable that corresponds to their invocation,
                        // so writes to per-vertex outputs must be of the form vertexTexCoord[gl_InvocationID]
                        ReturnHandlerSS << OutputVarName << "[gl_InvocationID] = " << SrcParamName << ";\\\n";
                    }
                } //
            );
        }
    }

    Prologue = PrologueSS.str();
    Globals  = GlobalsSS.str() + InterfaceVarsInSS.str() + InterfaceVarsOutSS.str();
}